

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.cpp
# Opt level: O1

void Diligent::ValidateCopyTextureParams(CopyTextureAttribs *CopyAttribs)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char (*in_RCX) [73];
  Box *Box;
  Box DstBox;
  Box SrcBox;
  undefined1 local_78 [20];
  int iStack_64;
  Box local_48;
  
  if ((CopyAttribs->pSrcTexture == (ITexture *)0x0) || (CopyAttribs->pDstTexture == (ITexture *)0x0)
     ) {
    FormatString<char[26],char[73]>
              ((string *)local_78,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "CopyAttribs.pSrcTexture != nullptr && CopyAttribs.pDstTexture != nullptr",in_RCX);
    DebugAssertionFailed
              ((Char *)local_78._0_8_,"ValidateCopyTextureParams",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x1b2);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,stack0xffffffffffffff98 + 1);
    }
  }
  local_48.MinX = 0;
  local_48.MaxX = 0;
  local_48.MinY = 0;
  local_48.MaxY = 0;
  local_48.MinZ = 0;
  local_48.MaxZ = 1;
  iVar1 = (*(CopyAttribs->pSrcTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  iVar2 = (*(CopyAttribs->pDstTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  Box = CopyAttribs->pSrcBox;
  if (Box == (Box *)0x0) {
    GetMipLevelProperties
              ((MipLevelProperties *)local_78,(TextureDesc *)CONCAT44(extraout_var,iVar1),
               CopyAttribs->SrcMipLevel);
    Box = &local_48;
    local_48.MaxX = local_78._0_4_;
    local_48.MaxY = local_78._4_4_;
    local_48.MaxZ = local_78._16_4_;
  }
  ValidateTextureRegion
            ((TextureDesc *)CONCAT44(extraout_var,iVar1),CopyAttribs->SrcMipLevel,
             CopyAttribs->SrcSlice,Box);
  local_78._4_4_ = (CopyAttribs->DstX + Box->MaxX) - Box->MinX;
  local_78._0_4_ = CopyAttribs->DstX;
  local_78._12_4_ = (CopyAttribs->DstY + Box->MaxY) - Box->MinY;
  local_78._8_4_ = CopyAttribs->DstY;
  iStack_64 = (CopyAttribs->DstZ + Box->MaxZ) - Box->MinZ;
  local_78._16_4_ = CopyAttribs->DstZ;
  ValidateTextureRegion
            ((TextureDesc *)CONCAT44(extraout_var_00,iVar2),CopyAttribs->DstMipLevel,
             CopyAttribs->DstSlice,(Box *)local_78);
  return;
}

Assistant:

void ValidateCopyTextureParams(const CopyTextureAttribs& CopyAttribs)
{
    VERIFY_EXPR(CopyAttribs.pSrcTexture != nullptr && CopyAttribs.pDstTexture != nullptr);
    Box                SrcBox;
    const TextureDesc& SrcTexDesc = CopyAttribs.pSrcTexture->GetDesc();
    const TextureDesc& DstTexDesc = CopyAttribs.pDstTexture->GetDesc();
    const Box*         pSrcBox    = CopyAttribs.pSrcBox;
    if (pSrcBox == nullptr)
    {
        MipLevelProperties MipLevelAttribs = GetMipLevelProperties(SrcTexDesc, CopyAttribs.SrcMipLevel);

        SrcBox.MaxX = MipLevelAttribs.LogicalWidth;
        SrcBox.MaxY = MipLevelAttribs.LogicalHeight;
        SrcBox.MaxZ = MipLevelAttribs.Depth;
        pSrcBox     = &SrcBox;
    }
    ValidateTextureRegion(SrcTexDesc, CopyAttribs.SrcMipLevel, CopyAttribs.SrcSlice, *pSrcBox);

    Box DstBox;
    DstBox.MinX = CopyAttribs.DstX;
    DstBox.MinY = CopyAttribs.DstY;
    DstBox.MinZ = CopyAttribs.DstZ;
    DstBox.MaxX = DstBox.MinX + pSrcBox->Width();
    DstBox.MaxY = DstBox.MinY + pSrcBox->Height();
    DstBox.MaxZ = DstBox.MinZ + pSrcBox->Depth();
    ValidateTextureRegion(DstTexDesc, CopyAttribs.DstMipLevel, CopyAttribs.DstSlice, DstBox);
}